

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void set_ivar(ixgbe_device *dev,int8_t direction,int8_t queue,int8_t msix_vector)

{
  uint32_t uVar1;
  byte in_CL;
  byte bVar2;
  byte in_DL;
  char in_SIL;
  long in_RDI;
  u32 index;
  u32 ivar;
  
  bVar2 = (in_DL & 1) * '\x10' + in_SIL * '\b';
  uVar1 = get_reg32(*(uint8_t **)(in_RDI + 0x70),((int)(char)in_DL >> 1) * 4 + 0x900);
  set_reg32(*(uint8_t **)(in_RDI + 0x70),((int)(char)in_DL >> 1) * 4 + 0x900,
            (int)(char)(in_CL | 0x80) << (bVar2 & 0x1f) |
            (0xff << (bVar2 & 0x1f) ^ 0xffffffffU) & uVar1);
  return;
}

Assistant:

static void set_ivar(struct ixgbe_device* dev, int8_t direction, int8_t queue, int8_t msix_vector) {
	u32 ivar, index;
	msix_vector |= IXGBE_IVAR_ALLOC_VAL;
	index = ((16 * (queue & 1)) + (8 * direction));
	ivar = get_reg32(dev->addr, IXGBE_IVAR(queue >> 1));
	ivar &= ~(0xFF << index);
	ivar |= (msix_vector << index);
	set_reg32(dev->addr, IXGBE_IVAR(queue >> 1), ivar);
}